

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  bool bVar1;
  size_t paragraphWidth;
  allocator<char> local_271;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string name;
  stringstream out;
  long local_1a0 [2];
  long lStack_190;
  uint auStack_188 [88];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  App::get_display_name_abi_cxx11_(&local_270,sub,true);
  ::std::operator+(&local_250,"  ",&local_270);
  bVar1 = sub->required_;
  if (bVar1 == true) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"REQUIRED",&local_271)
    ;
    FormatterBase::get_label(&local_230,&this->super_FormatterBase,&local_1f0);
    ::std::operator+(&local_210," ",&local_230);
  }
  else {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"",(allocator<char> *)&local_230);
  }
  ::std::operator+(&name,&local_250,&local_210);
  ::std::__cxx11::string::~string((string *)&local_210);
  if (bVar1 != false) {
    ::std::__cxx11::string::~string((string *)&local_230);
    ::std::__cxx11::string::~string((string *)&local_1f0);
  }
  ::std::__cxx11::string::~string((string *)&local_250);
  ::std::__cxx11::string::~string((string *)&local_270);
  *(long *)((long)&lStack_190 + *(long *)(local_1a0[0] + -0x18)) =
       (long)(int)(this->super_FormatterBase).column_width_;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffff4f | 0x20;
  ::std::operator<<((ostream *)local_1a0,(string *)&name);
  ::std::__cxx11::string::string((string *)&local_250,(string *)&sub->description_);
  paragraphWidth = (this->super_FormatterBase).right_column_width_;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ::std::__cxx11::string::_M_construct
            ((ulong)&local_270,(char)(this->super_FormatterBase).column_width_);
  detail::streamOutAsParagraph((ostream *)local_1a0,&local_250,paragraphWidth,&local_270,true);
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::__cxx11::string::~string((string *)&local_250);
  ::std::operator<<((ostream *)local_1a0,'\n');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    std::string name = "  " + sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : "");

    out << std::setw(static_cast<int>(column_width_)) << std::left << name;
    detail::streamOutAsParagraph(
        out, sub->get_description(), right_column_width_, std::string(column_width_, ' '), true);
    out << '\n';
    return out.str();
}